

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inftrees.c
# Opt level: O3

int zng_inflate_table(codetype type,uint16_t *lens,uint codes,code **table,uint *bits,uint16_t *work
                     )

{
  ushort *puVar1;
  code *pcVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  code *pcVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  uchar uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  uint16_t offs [16];
  uint local_c8;
  uint local_c0;
  uint16_t *local_a0;
  uint16_t *local_98;
  ushort local_88 [20];
  uint *local_60;
  ushort auStack_58 [20];
  uint16_t count [16];
  
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  if (codes != 0) {
    uVar21 = 0;
    do {
      local_88[lens[uVar21]] = local_88[lens[uVar21]] + 1;
      uVar21 = uVar21 + 1;
    } while (codes != uVar21);
  }
  uVar21 = 0xf;
  while (uVar16 = (uint)uVar21, local_88[uVar21] == 0) {
    uVar21 = (ulong)(uVar16 - 1);
    if (uVar16 - 1 == 0) {
      pcVar18 = *table;
      *table = pcVar18 + 1;
      pcVar18->op = '@';
      pcVar18->bits = '\x01';
      pcVar18->val = 0;
      pcVar18 = *table;
      *table = pcVar18 + 1;
      pcVar18->op = '@';
      pcVar18->bits = '\x01';
      pcVar18->val = 0;
      uVar23 = 1;
LAB_0010ba55:
      *bits = uVar23;
      return 0;
    }
  }
  uVar23 = *bits;
  if (uVar16 <= *bits) {
    uVar23 = uVar16;
  }
  iVar20 = 1;
  uVar25 = 1;
  if (1 < uVar16) {
    uVar24 = 1;
    do {
      uVar25 = uVar24;
      if (local_88[uVar24] != 0) break;
      uVar24 = uVar24 + 1;
      uVar25 = uVar21;
    } while (uVar21 != uVar24);
  }
  uVar21 = (ulong)uVar23;
  if (uVar23 <= (uint)uVar25) {
    uVar21 = uVar25 & 0xffffffff;
  }
  lVar19 = 1;
  do {
    iVar20 = iVar20 * 2 - (uint)local_88[lVar19];
    if (iVar20 < 0) {
      return -1;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x10);
  local_60 = bits;
  if ((iVar20 != 0) && (uVar16 != 1 || type == CODES)) {
    return -1;
  }
  auStack_58[1] = 0;
  lVar19 = 0;
  uVar10 = 0;
  do {
    uVar10 = uVar10 + local_88[lVar19 + 1];
    auStack_58[lVar19 + 2] = uVar10;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0xe);
  if (codes != 0) {
    uVar24 = 0;
    do {
      uVar15 = (ulong)lens[uVar24];
      if (uVar15 != 0) {
        uVar10 = auStack_58[uVar15];
        auStack_58[uVar15] = uVar10 + 1;
        work[uVar10] = (uint16_t)uVar24;
      }
      uVar24 = uVar24 + 1;
    } while (codes != uVar24);
  }
  uVar23 = (uint)uVar21;
  if (type == CODES) {
    local_c8 = 0x14;
    bVar27 = false;
    local_a0 = work;
    local_98 = work;
  }
  else {
    if (type == LENS) {
      if (10 < uVar23) {
        return 1;
      }
      bVar3 = 1;
      local_c8 = 0x101;
      local_98 = zng_inflate_table::lext;
      local_a0 = zng_inflate_table::lbase;
      bVar27 = false;
      goto LAB_0010bbaa;
    }
    local_c8 = 0;
    local_98 = zng_inflate_table::dext;
    local_a0 = zng_inflate_table::dbase;
    bVar27 = type == DISTS;
    if (bVar27) {
      bVar3 = 0;
      if (9 < uVar23) {
        return 1;
      }
      goto LAB_0010bbaa;
    }
  }
  bVar3 = 0;
LAB_0010bbaa:
  bVar8 = (byte)uVar21;
  uVar4 = 1 << (bVar8 & 0x1f);
  uVar5 = uVar4 - 1;
  pcVar18 = *table;
  local_c0 = 0xffffffff;
  uVar24 = 0;
  uVar17 = 0;
  uVar12 = 0;
  do {
    uVar6 = 1 << ((byte)uVar21 & 0x1f);
    do {
      uVar10 = work[uVar24];
      uVar11 = uVar10 - local_c8;
      if (uVar10 < local_c8) {
        bVar26 = local_c8 <= uVar10 + 1;
        if (bVar26) {
          uVar10 = 0;
        }
        uVar22 = '`';
        if (!bVar26) {
          uVar22 = '\0';
        }
      }
      else {
        uVar10 = local_a0[uVar11];
        uVar22 = (uchar)local_98[uVar11];
      }
      bVar9 = (char)uVar25 - (byte)uVar17;
      iVar20 = -1 << (bVar9 & 0x1f);
      uVar11 = uVar6;
      do {
        uVar14 = (uVar12 >> ((byte)uVar17 & 0x1f)) + iVar20 + uVar11;
        pcVar18[uVar14].op = uVar22;
        pcVar18[uVar14].bits = bVar9;
        pcVar18[uVar14].val = uVar10;
        uVar11 = uVar11 + iVar20;
      } while (uVar11 != 0);
      uVar11 = 1 << ((char)uVar25 - 1U & 0x1f);
      do {
        uVar14 = uVar11;
        uVar11 = uVar14 >> 1;
      } while ((uVar14 & uVar12) != 0);
      uVar12 = (uVar14 - 1 & uVar12) + uVar14;
      if (uVar14 == 0) {
        uVar12 = 0;
      }
      uVar24 = (ulong)((int)uVar24 + 1);
      puVar1 = local_88 + (uVar25 & 0xffffffff);
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        if ((uint)uVar25 == uVar16) {
          if (uVar12 != 0) {
            pcVar18[uVar12].op = '@';
            pcVar18[uVar12].bits = bVar9;
            pcVar18[uVar12].val = 0;
          }
          *table = *table + uVar4;
          bits = local_60;
          goto LAB_0010ba55;
        }
        uVar25 = (ulong)lens[work[uVar24]];
      }
      uVar11 = (uint)uVar25;
    } while ((uVar11 <= uVar23) || (uVar14 = uVar12 & uVar5, uVar14 == local_c0));
    if (uVar17 == 0) {
      uVar17 = uVar23;
    }
    uVar13 = uVar11 - uVar17;
    iVar20 = 1 << ((byte)uVar13 & 0x1f);
    if (uVar11 < uVar16) {
      uVar13 = uVar16 - uVar17;
      uVar21 = uVar25 & 0xffffffff;
      do {
        iVar7 = iVar20 - (uint)local_88[uVar21];
        if (iVar7 == 0 || iVar20 < (int)(uint)local_88[uVar21]) {
          uVar13 = (int)uVar21 - uVar17;
          break;
        }
        iVar20 = iVar7 * 2;
        uVar11 = (int)uVar21 + 1;
        uVar21 = (ulong)uVar11;
      } while (uVar11 < uVar16);
      iVar20 = 1 << ((byte)uVar13 & 0x1f);
    }
    uVar21 = (ulong)uVar13;
    uVar4 = uVar4 + iVar20;
    if ((bool)(bVar3 & 0x534 < uVar4)) {
      return 1;
    }
    if ((bool)(0x250 < uVar4 & bVar27)) {
      return 1;
    }
    pcVar18 = pcVar18 + uVar6;
    pcVar2 = *table;
    pcVar2[uVar14].op = (uchar)uVar13;
    pcVar2[uVar14].bits = bVar8;
    pcVar2[uVar14].val = (uint16_t)((uint)((int)pcVar18 - (int)pcVar2) >> 2);
    local_c0 = uVar14;
  } while( true );
}

Assistant:

int Z_INTERNAL zng_inflate_table(codetype type, uint16_t *lens, unsigned codes,
                                code * *table, unsigned *bits, uint16_t *work) {
    unsigned len;               /* a code's length in bits */
    unsigned sym;               /* index of code symbols */
    unsigned min, max;          /* minimum and maximum code lengths */
    unsigned root;              /* number of index bits for root table */
    unsigned curr;              /* number of index bits for current table */
    unsigned drop;              /* code bits to drop for sub-table */
    int left;                   /* number of prefix codes available */
    unsigned used;              /* code entries in table used */
    unsigned huff;              /* Huffman code */
    unsigned incr;              /* for incrementing code, index */
    unsigned fill;              /* index for replicating entries */
    unsigned low;               /* low bits for current root entry */
    unsigned mask;              /* mask for low root bits */
    code here;                  /* table entry for duplication */
    code *next;                 /* next available space in table */
    const uint16_t *base;       /* base value table to use */
    const uint16_t *extra;      /* extra bits table to use */
    unsigned match;             /* use base and extra for symbol >= match */
    uint16_t count[MAX_BITS+1];  /* number of codes of each length */
    uint16_t offs[MAX_BITS+1];   /* offsets in table for each length */
    static const uint16_t lbase[31] = { /* Length codes 257..285 base */
        3, 4, 5, 6, 7, 8, 9, 10, 11, 13, 15, 17, 19, 23, 27, 31,
        35, 43, 51, 59, 67, 83, 99, 115, 131, 163, 195, 227, 258, 0, 0};
    static const uint16_t lext[31] = { /* Length codes 257..285 extra */
        16, 16, 16, 16, 16, 16, 16, 16, 17, 17, 17, 17, 18, 18, 18, 18,
        19, 19, 19, 19, 20, 20, 20, 20, 21, 21, 21, 21, 16, 203, 77};
    static const uint16_t dbase[32] = { /* Distance codes 0..29 base */
        1, 2, 3, 4, 5, 7, 9, 13, 17, 25, 33, 49, 65, 97, 129, 193,
        257, 385, 513, 769, 1025, 1537, 2049, 3073, 4097, 6145,
        8193, 12289, 16385, 24577, 0, 0};
    static const uint16_t dext[32] = { /* Distance codes 0..29 extra */
        16, 16, 16, 16, 17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22,
        23, 23, 24, 24, 25, 25, 26, 26, 27, 27,
        28, 28, 29, 29, 64, 64};

    /*
       Process a set of code lengths to create a canonical Huffman code.  The
       code lengths are lens[0..codes-1].  Each length corresponds to the
       symbols 0..codes-1.  The Huffman code is generated by first sorting the
       symbols by length from short to long, and retaining the symbol order
       for codes with equal lengths.  Then the code starts with all zero bits
       for the first code of the shortest length, and the codes are integer
       increments for the same length, and zeros are appended as the length
       increases.  For the deflate format, these bits are stored backwards
       from their more natural integer increment ordering, and so when the
       decoding tables are built in the large loop below, the integer codes
       are incremented backwards.

       This routine assumes, but does not check, that all of the entries in
       lens[] are in the range 0..MAXBITS.  The caller must assure this.
       1..MAXBITS is interpreted as that code length.  zero means that that
       symbol does not occur in this code.

       The codes are sorted by computing a count of codes for each length,
       creating from that a table of starting indices for each length in the
       sorted table, and then entering the symbols in order in the sorted
       table.  The sorted table is work[], with that space being provided by
       the caller.

       The length counts are used for other purposes as well, i.e. finding
       the minimum and maximum length codes, determining if there are any
       codes at all, checking for a valid set of lengths, and looking ahead
       at length counts to determine sub-table sizes when building the
       decoding tables.
     */

    /* accumulate lengths for codes (assumes lens[] all in 0..MAXBITS) */
    for (len = 0; len <= MAX_BITS; len++)
        count[len] = 0;
    for (sym = 0; sym < codes; sym++)
        count[lens[sym]]++;

    /* bound code lengths, force root to be within code lengths */
    root = *bits;
    for (max = MAX_BITS; max >= 1; max--)
        if (count[max] != 0) break;
    root = MIN(root, max);
    if (UNLIKELY(max == 0)) {           /* no symbols to code at all */
        here.op = (unsigned char)64;    /* invalid code marker */
        here.bits = (unsigned char)1;
        here.val = (uint16_t)0;
        *(*table)++ = here;             /* make a table to force an error */
        *(*table)++ = here;
        *bits = 1;
        return 0;     /* no symbols, but wait for decoding to report error */
    }
    for (min = 1; min < max; min++)
        if (count[min] != 0) break;
    root = MAX(root, min);

    /* check for an over-subscribed or incomplete set of lengths */
    left = 1;
    for (len = 1; len <= MAX_BITS; len++) {
        left <<= 1;
        left -= count[len];
        if (left < 0) return -1;        /* over-subscribed */
    }
    if (left > 0 && (type == CODES || max != 1))
        return -1;                      /* incomplete set */

    /* generate offsets into symbol table for each length for sorting */
    offs[1] = 0;
    for (len = 1; len < MAX_BITS; len++)
        offs[len + 1] = offs[len] + count[len];

    /* sort symbols by length, by symbol order within each length */
    for (sym = 0; sym < codes; sym++)
        if (lens[sym] != 0) work[offs[lens[sym]]++] = (uint16_t)sym;

    /*
       Create and fill in decoding tables.  In this loop, the table being
       filled is at next and has curr index bits.  The code being used is huff
       with length len.  That code is converted to an index by dropping drop
       bits off of the bottom.  For codes where len is less than drop + curr,
       those top drop + curr - len bits are incremented through all values to
       fill the table with replicated entries.

       root is the number of index bits for the root table.  When len exceeds
       root, sub-tables are created pointed to by the root entry with an index
       of the low root bits of huff.  This is saved in low to check for when a
       new sub-table should be started.  drop is zero when the root table is
       being filled, and drop is root when sub-tables are being filled.

       When a new sub-table is needed, it is necessary to look ahead in the
       code lengths to determine what size sub-table is needed.  The length
       counts are used for this, and so count[] is decremented as codes are
       entered in the tables.

       used keeps track of how many table entries have been allocated from the
       provided *table space.  It is checked for LENS and DIST tables against
       the constants ENOUGH_LENS and ENOUGH_DISTS to guard against changes in
       the initial root table size constants.  See the comments in inftrees.h
       for more information.

       sym increments through all symbols, and the loop terminates when
       all codes of length max, i.e. all codes, have been processed.  This
       routine permits incomplete codes, so another loop after this one fills
       in the rest of the decoding tables with invalid code markers.
     */

    /* set up for code type */
    switch (type) {
    case CODES:
        base = extra = work;    /* dummy value--not used */
        match = 20;
        break;
    case LENS:
        base = lbase;
        extra = lext;
        match = 257;
        break;
    default:    /* DISTS */
        base = dbase;
        extra = dext;
        match = 0;
    }

    /* initialize state for loop */
    huff = 0;                   /* starting code */
    sym = 0;                    /* starting code symbol */
    len = min;                  /* starting code length */
    next = *table;              /* current table to fill in */
    curr = root;                /* current table index bits */
    drop = 0;                   /* current bits to drop from code for index */
    low = (unsigned)(-1);       /* trigger new sub-table when len > root */
    used = 1U << root;          /* use root table entries */
    mask = used - 1;            /* mask for comparing low */

    /* check available table space */
    if ((type == LENS && used > ENOUGH_LENS) ||
        (type == DISTS && used > ENOUGH_DISTS))
        return 1;

    /* process all codes and make table entries */
    for (;;) {
        /* create table entry */
        here.bits = (unsigned char)(len - drop);
        if (LIKELY(work[sym] >= match)) {
            here.op = (unsigned char)(extra[work[sym] - match]);
            here.val = base[work[sym] - match];
        } else if (work[sym] + 1U < match) {
            here.op = (unsigned char)0;
            here.val = work[sym];
        } else {
            here.op = (unsigned char)(32 + 64);         /* end of block */
            here.val = 0;
        }

        /* replicate for those indices with low len bits equal to huff */
        incr = 1U << (len - drop);
        fill = 1U << curr;
        min = fill;                 /* save offset to next table */
        do {
            fill -= incr;
            next[(huff >> drop) + fill] = here;
        } while (fill != 0);

        /* backwards increment the len-bit code huff */
        incr = 1U << (len - 1);
        while (huff & incr)
            incr >>= 1;
        if (incr != 0) {
            huff &= incr - 1;
            huff += incr;
        } else {
            huff = 0;
        }

        /* go to next symbol, update count, len */
        sym++;
        if (--(count[len]) == 0) {
            if (len == max)
                break;
            len = lens[work[sym]];
        }

        /* create new sub-table if needed */
        if (len > root && (huff & mask) != low) {
            /* if first time, transition to sub-tables */
            if (drop == 0)
                drop = root;

            /* increment past last table */
            next += min;            /* here min is 1 << curr */

            /* determine length of next table */
            curr = len - drop;
            left = (int)(1 << curr);
            while (curr + drop < max) {
                left -= count[curr + drop];
                if (left <= 0)
                    break;
                curr++;
                left <<= 1;
            }

            /* check for enough space */
            used += 1U << curr;
            if ((type == LENS && used > ENOUGH_LENS) || (type == DISTS && used > ENOUGH_DISTS))
                return 1;

            /* point entry in root table to sub-table */
            low = huff & mask;
            (*table)[low].op = (unsigned char)curr;
            (*table)[low].bits = (unsigned char)root;
            (*table)[low].val = (uint16_t)(next - *table);
        }
    }

    /* fill in remaining table entry if code is incomplete (guaranteed to have
       at most one remaining entry, since if the code is incomplete, the
       maximum code length that was allowed to get this far is one bit) */
    if (UNLIKELY(huff != 0)) {
        here.op = (unsigned char)64;            /* invalid code marker */
        here.bits = (unsigned char)(len - drop);
        here.val = (uint16_t)0;
        next[huff] = here;
    }

    /* set return parameters */
    *table += used;
    *bits = root;
    return 0;
}